

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void write_account(short account_type)

{
  short sVar1;
  int iVar2;
  undefined1 local_520 [8];
  SavingAccount sac;
  BusinessAccount bac;
  CreditAccount cac;
  DebitAccount dac;
  ofstream outFile;
  undefined1 local_28c [8];
  Client client;
  ofstream outFileClient;
  short account_type_local;
  
  std::ofstream::ofstream(&client.total_balance);
  Client::Client((Client *)local_28c);
  std::operator|(_S_bin,_S_app);
  std::ofstream::open((char *)&client.total_balance,0x10782a);
  Client::create_client((Client *)local_28c);
  std::ostream::write((char *)&client.total_balance,(long)local_28c);
  std::ofstream::close();
  std::ofstream::ofstream(&dac.super_Account.client_class);
  switch(account_type) {
  case 1:
    DebitAccount::DebitAccount((DebitAccount *)&cac.super_Account.client_class);
    std::operator|(_S_bin,_S_app);
    std::ofstream::open((char *)&dac.super_Account.client_class,0x107145);
    iVar2 = Client::get_client_id((Client *)local_28c);
    sVar1 = Client::get_client_class((Client *)local_28c);
    Account::create_account((Account *)&cac.super_Account.client_class,account_type,iVar2,sVar1);
    std::ostream::write((char *)&dac.super_Account.client_class,
                        (long)&cac.super_Account.client_class);
    std::ofstream::close();
    break;
  case 2:
    CreditAccount::CreditAccount((CreditAccount *)&bac.super_Account.client_class);
    std::operator|(_S_bin,_S_app);
    std::ofstream::open((char *)&dac.super_Account.client_class,0x107145);
    iVar2 = Client::get_client_id((Client *)local_28c);
    sVar1 = Client::get_client_class((Client *)local_28c);
    CreditAccount::create_account((CreditAccount *)&bac.super_Account.client_class,iVar2,sVar1);
    std::ostream::write((char *)&dac.super_Account.client_class,
                        (long)&bac.super_Account.client_class);
    std::ofstream::close();
    break;
  case 3:
    BusinessAccount::BusinessAccount((BusinessAccount *)&sac.super_Account.client_class);
    std::operator|(_S_bin,_S_app);
    std::ofstream::open((char *)&dac.super_Account.client_class,0x107145);
    iVar2 = Client::get_client_id((Client *)local_28c);
    sVar1 = Client::get_client_class((Client *)local_28c);
    Account::create_account((Account *)&sac.super_Account.client_class,account_type,iVar2,sVar1);
    std::ostream::write((char *)&dac.super_Account.client_class,
                        (long)&sac.super_Account.client_class);
    std::ofstream::close();
    break;
  case 4:
    SavingAccount::SavingAccount((SavingAccount *)local_520);
    std::operator|(_S_bin,_S_app);
    std::ofstream::open((char *)&dac.super_Account.client_class,0x107145);
    iVar2 = Client::get_client_id((Client *)local_28c);
    sVar1 = Client::get_client_class((Client *)local_28c);
    Account::create_account((Account *)local_520,account_type,iVar2,sVar1);
    std::ostream::write((char *)&dac.super_Account.client_class,(long)local_520);
    std::ofstream::close();
    break;
  default:
    std::operator<<((ostream *)&std::cout,"wrong choice");
  }
  std::ofstream::~ofstream(&dac.super_Account.client_class);
  std::ofstream::~ofstream(&client.total_balance);
  return;
}

Assistant:

void write_account(short account_type)
{
    /*!
     * It is a helper function that writes the proper account details both
     * into Client.dat and Account.dat
     */

    std::ofstream outFileClient;
    Client client;
    outFileClient.open("Client.dat", std::ios::binary|std::ios::app);
    client.create_client();
    outFileClient.write((char *) &client, sizeof(Client));
    outFileClient.close();

    std::ofstream outFile;
    switch (account_type) {
        case 1:
        {
            DebitAccount dac;
            outFile.open("Account.dat",std::ios::binary|std::ios::app);
            dac.create_account(account_type, client.get_client_id(), client.get_client_class());
            outFile.write((char *) &dac, sizeof(Account));
            outFile.close();
            break;
        }


        case 2: {
            CreditAccount cac;
            outFile.open("Account.dat", std::ios::binary | std::ios::app);
            cac.create_account(client.get_client_id(), client.get_client_class());
            outFile.write((char *) &cac, sizeof(Account));
            outFile.close();
            break;
        }
        case 3: {
            BusinessAccount bac;
            outFile.open("Account.dat", std::ios::binary | std::ios::app);
            bac.create_account(account_type, client.get_client_id(), client.get_client_class());
            outFile.write((char *) &bac, sizeof(Account));
            outFile.close();
            break;
        }
        case 4: {
            SavingAccount sac;
            outFile.open("Account.dat", std::ios::binary | std::ios::app);
            sac.create_account(account_type, client.get_client_id(), client.get_client_class());
            outFile.write((char *) &sac, sizeof(Account));
            outFile.close();
            break;
        }

        default :std::cout<<"wrong choice";

    }


}